

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O2

bool __thiscall GMESong::StartTrack(GMESong *this,int track,bool getcritsec)

{
  Music_Emu *me;
  int start_msec;
  gme_err_t pcVar1;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,getcritsec) != 0) {
    FCriticalSection::Enter(&this->CritSec);
  }
  pcVar1 = gme_start_track(this->Emu,track);
  if (getcritsec) {
    FCriticalSection::Leave(&this->CritSec);
  }
  if (pcVar1 == (gme_err_t)0x0) {
    this->CurrTrack = track;
    GetTrackInfo(this);
    if ((this->super_StreamSong).super_MusInfo.m_Looping == false) {
      me = this->Emu;
      start_msec = CalcSongLength(this);
      gme_set_fade(me,start_msec);
    }
  }
  else {
    Printf("Could not start track %d: %s\n",track,pcVar1);
  }
  return pcVar1 == (gme_err_t)0x0;
}

Assistant:

bool GMESong::StartTrack(int track, bool getcritsec)
{
	gme_err_t err;

	if (getcritsec)
	{
		CritSec.Enter();
	}
	err = gme_start_track(Emu, track);
	if (getcritsec)
	{
		CritSec.Leave();
	}
	if (err != NULL)
	{
		Printf("Could not start track %d: %s\n", track, err);
		return false;
	}
	CurrTrack = track;
	GetTrackInfo();
	if (!m_Looping)
	{
		gme_set_fade(Emu, CalcSongLength());
	}
	return true;
}